

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

_Bool earlier_object(object *orig,object *new,_Bool store)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  _Bool store_local;
  object *new_local;
  object *orig_local;
  
  if (new == (object *)0x0) {
    orig_local._7_1_ = false;
  }
  else if (orig == (object *)0x0) {
    orig_local._7_1_ = true;
  }
  else {
    if (!store) {
      _Var1 = obj_can_browse(orig);
      if ((_Var1) && (_Var1 = obj_can_browse(new), !_Var1)) {
        return false;
      }
      _Var1 = obj_can_browse(orig);
      if ((!_Var1) && (_Var1 = obj_can_browse(new), _Var1)) {
        return true;
      }
    }
    _Var1 = tval_is_ammo(orig);
    if ((_Var1) && (_Var1 = tval_is_ammo(new), _Var1)) {
      if (((player->state).ammo_tval == (uint)orig->tval) &&
         ((player->state).ammo_tval != (uint)new->tval)) {
        return false;
      }
      if (((player->state).ammo_tval != (uint)orig->tval) &&
         ((player->state).ammo_tval == (uint)new->tval)) {
        return true;
      }
    }
    if (new->tval < orig->tval) {
      orig_local._7_1_ = false;
    }
    else if (orig->tval < new->tval) {
      orig_local._7_1_ = true;
    }
    else {
      if (!store) {
        _Var1 = object_flavor_is_aware(new);
        if (!_Var1) {
          return false;
        }
        _Var1 = object_flavor_is_aware(orig);
        if (!_Var1) {
          return true;
        }
      }
      if (orig->sval < new->sval) {
        orig_local._7_1_ = false;
      }
      else if (new->sval < orig->sval) {
        orig_local._7_1_ = true;
      }
      else {
        if (!store) {
          if ((new->kind->flavor != (flavor *)0x0) && (_Var1 = object_flavor_is_aware(new), !_Var1))
          {
            return false;
          }
          if ((orig->kind->flavor != (flavor *)0x0) &&
             (_Var1 = object_flavor_is_aware(orig), !_Var1)) {
            return true;
          }
          _Var1 = tval_is_light(orig);
          if (_Var1) {
            if (new->pval < orig->pval) {
              return false;
            }
            if (orig->pval < new->pval) {
              return true;
            }
          }
        }
        _Var1 = tval_is_ammo(orig);
        if (_Var1) {
          wVar2 = object_value(orig,L'\x01');
          wVar3 = object_value(new,L'\x01');
          if (wVar2 < wVar3) {
            return false;
          }
          wVar2 = object_value(orig,L'\x01');
          wVar3 = object_value(new,L'\x01');
          if (wVar3 < wVar2) {
            return true;
          }
        }
        else {
          wVar2 = object_value(orig,L'\x01');
          wVar3 = object_value(new,L'\x01');
          if (wVar3 < wVar2) {
            return false;
          }
          wVar2 = object_value(orig,L'\x01');
          wVar3 = object_value(new,L'\x01');
          if (wVar2 < wVar3) {
            return true;
          }
        }
        orig_local._7_1_ = false;
      }
    }
  }
  return orig_local._7_1_;
}

Assistant:

bool earlier_object(struct object *orig, struct object *new, bool store)
{
	/* Check we have actual objects */
	if (!new) return false;
	if (!orig) return true;

	if (!store) {
		/* Readable books always come first */
		if (obj_can_browse(orig) && !obj_can_browse(new)) return false;
		if (!obj_can_browse(orig) && obj_can_browse(new)) return true;
	}

	/* Usable ammo is before other ammo */
	if (tval_is_ammo(orig) && tval_is_ammo(new)) {
		/* First favour usable ammo */
		if ((player->state.ammo_tval == orig->tval) &&
			(player->state.ammo_tval != new->tval))
			return false;
		if ((player->state.ammo_tval != orig->tval) &&
			(player->state.ammo_tval == new->tval))
			return true;
	}

	/* Objects sort by decreasing type */
	if (orig->tval > new->tval) return false;
	if (orig->tval < new->tval) return true;

	if (!store) {
		/* Non-aware (flavored) items always come last (default to orig) */
		if (!object_flavor_is_aware(new)) return false;
		if (!object_flavor_is_aware(orig)) return true;
	}

	/* Objects sort by increasing sval */
	if (orig->sval < new->sval) return false;
	if (orig->sval > new->sval) return true;

	if (!store) {
		/* Unaware objects always come last (default to orig) */
		if (new->kind->flavor && !object_flavor_is_aware(new)) return false;
		if (orig->kind->flavor && !object_flavor_is_aware(orig)) return true;

		/* Lights sort by decreasing fuel */
		if (tval_is_light(orig)) {
			if (orig->pval > new->pval) return false;
			if (orig->pval < new->pval) return true;
		}
	}

	/* Objects sort by decreasing value, except ammo */
	if (tval_is_ammo(orig)) {
		if (object_value(orig, 1) < object_value(new, 1))
			return false;
		if (object_value(orig, 1) >	object_value(new, 1))
			return true;
	} else {
		if (object_value(orig, 1) >	object_value(new, 1))
			return false;
		if (object_value(orig, 1) <	object_value(new, 1))
			return true;
	}

	/* No preference */
	return false;
}